

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sign.c
# Opt level: O0

int EVP_SignFinal_ex(EVP_MD_CTX *ctx,uchar *sigret,uint *siglen,EVP_PKEY *pkey,OSSL_LIB_CTX *libctx,
                    char *propq)

{
  int iVar1;
  undefined4 *in_RDX;
  uchar *in_RSI;
  EVP_MD_CTX *in_RDI;
  EVP_MD_CTX *tmp_ctx;
  int rv;
  EVP_PKEY_CTX *pkctx;
  size_t sltmp;
  int i;
  uint m_len;
  uchar m [64];
  EVP_PKEY *in_stack_ffffffffffffff58;
  OSSL_LIB_CTX *in_stack_ffffffffffffff60;
  EVP_MD *md;
  EVP_MD *ctx_00;
  size_t local_88;
  int local_80;
  uint local_7c;
  uchar local_78 [88];
  undefined4 *local_20;
  uchar *local_18;
  EVP_MD_CTX *local_10;
  
  local_7c = 0;
  local_80 = 0;
  md = (EVP_MD *)0x0;
  *in_RDX = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = EVP_MD_CTX_test_flags((EVP_MD_CTX *)in_RDI,0x200);
  if (iVar1 == 0) {
    iVar1 = 0;
    in_stack_ffffffffffffff60 = (OSSL_LIB_CTX *)EVP_MD_CTX_new();
    if (in_stack_ffffffffffffff60 == (OSSL_LIB_CTX *)0x0) {
      ERR_new();
      ERR_set_debug((char *)md,iVar1,(char *)in_stack_ffffffffffffff60);
      ERR_set_error(6,0xc0100,(char *)0x0);
      return 0;
    }
    iVar1 = EVP_MD_CTX_copy_ex((EVP_MD_CTX *)in_stack_ffffffffffffff60,(EVP_MD_CTX *)local_10);
    if (iVar1 != 0) {
      iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)in_stack_ffffffffffffff60,local_78,&local_7c);
    }
    EVP_MD_CTX_free((EVP_MD_CTX *)0x436a50);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)local_10,local_78,&local_7c);
    if (iVar1 == 0) goto LAB_00436b28;
  }
  iVar1 = EVP_PKEY_get_size((EVP_PKEY *)in_stack_ffffffffffffff60);
  local_88 = (size_t)iVar1;
  local_80 = 0;
  md = (EVP_MD *)
       EVP_PKEY_CTX_new_from_pkey
                 (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(char *)0x436a9c);
  if ((md != (EVP_MD *)0x0) && (iVar1 = EVP_PKEY_sign_init((EVP_PKEY_CTX *)md), 0 < iVar1)) {
    ctx_00 = md;
    EVP_MD_CTX_get0_md(local_10);
    iVar1 = EVP_PKEY_CTX_set_signature_md((EVP_PKEY_CTX *)in_stack_ffffffffffffff60,md);
    md = ctx_00;
    if ((0 < iVar1) &&
       (iVar1 = EVP_PKEY_sign((EVP_PKEY_CTX *)ctx_00,local_18,&local_88,local_78,(ulong)local_7c),
       md = ctx_00, 0 < iVar1)) {
      *local_20 = (int)local_88;
      local_80 = 1;
    }
  }
LAB_00436b28:
  EVP_PKEY_CTX_free((EVP_PKEY_CTX *)md);
  return local_80;
}

Assistant:

int EVP_SignFinal_ex(EVP_MD_CTX *ctx, unsigned char *sigret,
                     unsigned int *siglen, EVP_PKEY *pkey, OSSL_LIB_CTX *libctx,
                     const char *propq)
{
    unsigned char m[EVP_MAX_MD_SIZE];
    unsigned int m_len = 0;
    int i = 0;
    size_t sltmp;
    EVP_PKEY_CTX *pkctx = NULL;

    *siglen = 0;
    if (EVP_MD_CTX_test_flags(ctx, EVP_MD_CTX_FLAG_FINALISE)) {
        if (!EVP_DigestFinal_ex(ctx, m, &m_len))
            goto err;
    } else {
        int rv = 0;
        EVP_MD_CTX *tmp_ctx = EVP_MD_CTX_new();

        if (tmp_ctx == NULL) {
            ERR_raise(ERR_LIB_EVP, ERR_R_MALLOC_FAILURE);
            return 0;
        }
        rv = EVP_MD_CTX_copy_ex(tmp_ctx, ctx);
        if (rv)
            rv = EVP_DigestFinal_ex(tmp_ctx, m, &m_len);
        EVP_MD_CTX_free(tmp_ctx);
        if (!rv)
            return 0;
    }

    sltmp = (size_t)EVP_PKEY_get_size(pkey);
    i = 0;
    pkctx = EVP_PKEY_CTX_new_from_pkey(libctx, pkey, propq);
    if (pkctx == NULL)
        goto err;
    if (EVP_PKEY_sign_init(pkctx) <= 0)
        goto err;
    if (EVP_PKEY_CTX_set_signature_md(pkctx, EVP_MD_CTX_get0_md(ctx)) <= 0)
        goto err;
    if (EVP_PKEY_sign(pkctx, sigret, &sltmp, m, m_len) <= 0)
        goto err;
    *siglen = sltmp;
    i = 1;
 err:
    EVP_PKEY_CTX_free(pkctx);
    return i;
}